

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

bool __thiscall QListModel::clearItemData(QListModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  long lVar2;
  QListWidgetItemPrivate *pQVar3;
  char cVar4;
  QWidgetItemData *pQVar5;
  QWidgetItemData *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QAbstractItemModel::checkIndex(this,index,1);
  if (cVar4 == '\0') goto LAB_00585e0a;
  pQVar3 = (this->items).d.ptr[index->r]->d;
  pQVar6 = (pQVar3->values).d.ptr;
  lVar7 = (pQVar3->values).d.size;
  pQVar1 = pQVar6 + lVar7;
  lVar7 = lVar7 >> 2;
  pQVar5 = pQVar6;
  if (0 < lVar7) {
    pQVar5 = pQVar6 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pQVar6 = pQVar6 + 2;
    do {
      if (3 < *(ulong *)&pQVar6[-2].value.d.field_0x18) {
        pQVar6 = pQVar6 + -2;
        goto LAB_00585db6;
      }
      if (3 < *(ulong *)&pQVar6[-1].value.d.field_0x18) {
        pQVar6 = pQVar6 + -1;
        goto LAB_00585db6;
      }
      if (3 < *(ulong *)&(pQVar6->value).d.field_0x18) goto LAB_00585db6;
      if (3 < *(ulong *)&pQVar6[1].value.d.field_0x18) {
        pQVar6 = pQVar6 + 1;
        goto LAB_00585db6;
      }
      lVar7 = lVar7 + -1;
      pQVar6 = pQVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pQVar1 - (long)pQVar5 >> 3) * -0x3333333333333333;
  if (lVar7 == 1) {
LAB_00585d98:
    pQVar6 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar6 = pQVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_00585d8d:
    pQVar6 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar5 = pQVar5 + 1;
      goto LAB_00585d98;
    }
  }
  else {
    pQVar6 = pQVar1;
    if ((lVar7 == 3) && (pQVar6 = pQVar5, *(ulong *)&(pQVar5->value).d.field_0x18 < 4)) {
      pQVar5 = pQVar5 + 1;
      goto LAB_00585d8d;
    }
  }
LAB_00585db6:
  if (pQVar6 != pQVar1) {
    QList<QWidgetItemData>::clear(&pQVar3->values);
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
  }
LAB_00585e0a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QListWidgetItem *item = items.at(index.row());
    const auto beginIter = item->d->values.cbegin();
    const auto endIter = item->d->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    item->d->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}